

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Samba.cpp
# Opt level: O1

int __thiscall Samba::init(Samba *this,EVP_PKEY_CTX *ctx)

{
  SerialPort *pSVar1;
  long lVar2;
  undefined1 *puVar3;
  uint8_t cmd [3];
  string ver;
  uint8_t dummy [1024];
  undefined2 local_45b;
  undefined1 *local_458;
  undefined8 local_450;
  undefined1 local_448;
  undefined7 uStack_447;
  string local_438;
  undefined1 local_418 [1024];
  
  pSVar1 = (this->_port)._M_t.super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>.
           _M_t.super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
           super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
  (*pSVar1->_vptr_SerialPort[9])(pSVar1,100);
  pSVar1 = (this->_port)._M_t.super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>.
           _M_t.super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
           super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
  (*pSVar1->_vptr_SerialPort[5])(pSVar1,local_418,0x400);
  if (this->_isUsb == false) {
    if (this->_debug == true) {
      puts("Send auto-baud");
    }
    pSVar1 = (this->_port)._M_t.super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>.
             _M_t.super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
             super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
    (*pSVar1->_vptr_SerialPort[8])(pSVar1,0x80);
    (*((this->_port)._M_t.super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>._M_t.
       super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
       super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl)->_vptr_SerialPort[7])();
    pSVar1 = (this->_port)._M_t.super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>.
             _M_t.super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
             super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
    (*pSVar1->_vptr_SerialPort[8])(pSVar1,0x80);
    (*((this->_port)._M_t.super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>._M_t.
       super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
       super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl)->_vptr_SerialPort[7])();
    pSVar1 = (this->_port)._M_t.super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>.
             _M_t.super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
             super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
    (*pSVar1->_vptr_SerialPort[8])(pSVar1,0x23);
    pSVar1 = (this->_port)._M_t.super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>.
             _M_t.super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
             super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
    (*pSVar1->_vptr_SerialPort[5])(pSVar1,&local_45b,3);
  }
  if (this->_debug == true) {
    puts("Set binary mode");
  }
  local_45b = 0x234e;
  pSVar1 = (this->_port)._M_t.super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>.
           _M_t.super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
           super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
  (*pSVar1->_vptr_SerialPort[6])(pSVar1,&local_45b,2);
  pSVar1 = (this->_port)._M_t.super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>.
           _M_t.super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
           super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
  (*pSVar1->_vptr_SerialPort[5])(pSVar1,&local_45b,2);
  local_450 = 0;
  local_448 = 0;
  local_458 = &local_448;
  version_abi_cxx11_(&local_438,this);
  std::__cxx11::string::operator=((string *)&local_458,(string *)&local_438);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438._M_dataplus._M_p != &local_438.field_2) {
    operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
  }
  lVar2 = std::__cxx11::string::find((char *)&local_458,0x112504,0);
  if (lVar2 != -1) {
    puVar3 = local_458 + lVar2 + 9;
    do {
      switch(*puVar3) {
      case 0x58:
        this->_canChipErase = true;
        break;
      case 0x59:
        this->_canWriteBuffer = true;
        break;
      case 0x5a:
        this->_canChecksumBuffer = true;
        break;
      case 0x5d:
        goto switchD_0010b9d1_caseD_5d;
      }
      puVar3 = puVar3 + 1;
    } while( true );
  }
LAB_0010b9f5:
  pSVar1 = (this->_port)._M_t.super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>.
           _M_t.super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
           super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
  (*pSVar1->_vptr_SerialPort[9])(pSVar1,1000);
  if (local_458 != &local_448) {
    operator_delete(local_458,CONCAT71(uStack_447,local_448) + 1);
  }
  return (int)CONCAT71((int7)((ulong)this >> 8),1);
switchD_0010b9d1_caseD_5d:
  if (this->_isUsb == true) {
    this->_readBufferSize = 0x3f;
  }
  goto LAB_0010b9f5;
}

Assistant:

bool
Samba::init()
{
    
    uint8_t cmd[3];
    _port->timeout(TIMEOUT_QUICK);

    // Flush garbage
    uint8_t dummy[1024];
    _port->read(dummy, sizeof(dummy));

    if (!_isUsb)
    {
        if (_debug)
            printf("Send auto-baud\n");

        // RS-232 auto-baud sequence
        _port->put(0x80);
        _port->get();
        _port->put(0x80);
        _port->get();
        _port->put('#');
        _port->read(cmd, 3);
    }

    // Set binary mode
    if (_debug)
        printf("Set binary mode\n");

    cmd[0] = 'N';
    cmd[1] = '#';
    _port->write(cmd, 2);
    
    _port->read(cmd, 2);


    std::string ver;
    try
    {
        ver = version();
    }
    catch(SambaError& err)
    {
        return false;
    }

    std::size_t extIndex = ver.find("[Arduino:");
    
     
    if (extIndex != string::npos)
    {
        extIndex += 9;
        while (ver[extIndex] != ']')
        {
            switch (ver[extIndex])
            {
                case 'X': _canChipErase = true; break;
                case 'Y': _canWriteBuffer = true; break;
                case 'Z': _canChecksumBuffer = true; break;
            }
            extIndex++;
        }

        // All SAMD-based Arduino/AdaFruit boards have a bug in their bootloader
        // that trying to read 64 bytes or more over USB corrupts the data.
        // We must limit these boards to read chunks of 63 bytes.
        if (_isUsb)
            _readBufferSize = 63;
    }

    _port->timeout(TIMEOUT_NORMAL);

    return true;
}